

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleCubeSeamlessLinear
          (tcu *this,ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,Sampler *sampler,
          float s,float t,int depth)

{
  int size_00;
  Vector<float,_4> VVar1;
  Vec4 VVar2;
  Vector<float,_4> *local_148;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vector<float,_4> local_110;
  Vector<float,_4> local_100;
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  Vector<float,_4> local_a0;
  float local_90;
  float local_8c;
  float b;
  float a;
  Vec4 sampleColors [4];
  float local_40;
  float local_3c;
  float v;
  float u;
  int size;
  int depth_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  CubeFace baseFace_local;
  ConstPixelBufferAccess (*faceAccesses_local) [6];
  
  size_00 = ConstPixelBufferAccess::getWidth(*faceAccesses);
  local_40 = t;
  local_3c = s;
  if ((sampler->normalizedCoords & 1U) != 0) {
    local_3c = unnormalize(sampler->wrapS,s,size_00);
    local_40 = unnormalize(sampler->wrapT,t,size_00);
  }
  local_148 = (Vector<float,_4> *)&b;
  do {
    Vector<float,_4>::Vector(local_148);
    local_148 = local_148 + 1;
  } while (local_148 != (Vector<float,_4> *)(sampleColors[3].m_data + 2));
  getCubeLinearSamples(faceAccesses,baseFace,local_3c,local_40,depth,(Vec4 (*) [4])&b);
  local_8c = deFloatFrac(local_3c - 0.5);
  local_90 = deFloatFrac(local_40 - 0.5);
  operator*((tcu *)&local_d0,(Vector<float,_4> *)&b,1.0 - local_8c);
  operator*((tcu *)&local_c0,&local_d0,1.0 - local_90);
  operator*((tcu *)&local_f0,(Vector<float,_4> *)(sampleColors[0].m_data + 2),local_8c);
  operator*((tcu *)&local_e0,&local_f0,1.0 - local_90);
  operator+((tcu *)&local_b0,&local_c0,&local_e0);
  operator*((tcu *)&local_110,(Vector<float,_4> *)(sampleColors[1].m_data + 2),1.0 - local_8c);
  operator*((tcu *)&local_100,&local_110,local_90);
  operator+((tcu *)&local_a0,&local_b0,&local_100);
  operator*((tcu *)&local_130,(Vector<float,_4> *)(sampleColors[2].m_data + 2),local_8c);
  operator*((tcu *)&local_120,&local_130,local_90);
  VVar1 = operator+(this,&local_a0,&local_120);
  VVar2.m_data[0] = VVar1.m_data[0];
  VVar2.m_data[1] = VVar1.m_data[1];
  VVar2.m_data[2] = VVar1.m_data[2];
  VVar2.m_data[3] = VVar1.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

static Vec4 sampleCubeSeamlessLinear (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, const Sampler& sampler, float s, float t, int depth)
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());

	int		size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float	u		= s;
	float	v		= t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, size);
		v = unnormalize(sampler.wrapT, t, size);
	}

	// Get sample colors.

	Vec4 sampleColors[4];
	getCubeLinearSamples(faceAccesses, baseFace, u, v, depth, sampleColors);

	// Interpolate.

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	return (sampleColors[0]*(1.0f-a)*(1.0f-b)) +
		   (sampleColors[1]*(     a)*(1.0f-b)) +
		   (sampleColors[2]*(1.0f-a)*(     b)) +
		   (sampleColors[3]*(     a)*(     b));
}